

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O3

Int64FeatureType * __thiscall
CoreML::Specification::DictionaryFeatureType::mutable_int64keytype(DictionaryFeatureType *this)

{
  ulong uVar1;
  Int64FeatureType *pIVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 1) {
    pIVar2 = (this->KeyType_).int64keytype_;
  }
  else {
    clear_KeyType(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pIVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64FeatureType>
                       (arena);
    (this->KeyType_).int64keytype_ = pIVar2;
  }
  return pIVar2;
}

Assistant:

inline ::CoreML::Specification::Int64FeatureType* DictionaryFeatureType::mutable_int64keytype() {
  ::CoreML::Specification::Int64FeatureType* _msg = _internal_mutable_int64keytype();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictionaryFeatureType.int64KeyType)
  return _msg;
}